

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  undefined8 *in_RSI;
  int in_EDI;
  string *in_stack_00002050;
  string *in_stack_00002058;
  string *in_stack_00002060;
  StreamClient *in_stack_00002068;
  DataAsDoubleCb_t *in_stack_fffffffffffffeb8;
  allocator *paVar3;
  StreamClient *in_stack_fffffffffffffec0;
  char *pcVar4;
  _func_void_SubscribedSignal_ptr_unsigned_long_double_ptr_unsigned_long *in_stack_fffffffffffffec8;
  function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
  *in_stack_fffffffffffffed0;
  bool local_f2;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
  local_a8 [3];
  allocator local_46;
  byte local_45;
  byte local_32;
  allocator local_31;
  string local_30 [32];
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  signal(0xf,sigHandler);
  signal(2,sigHandler);
  local_32 = 0;
  local_45 = 0;
  local_f2 = true;
  if (1 < local_8) {
    pcVar4 = (char *)local_10[1];
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string(local_30,pcVar4,&local_31);
    local_45 = 1;
    local_f2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
  }
  if ((local_45 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  if (local_f2 == false) {
    if ((main::streamMetaFilename_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&main::streamMetaFilename_abi_cxx11_), iVar1 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&main::streamMetaFilename_abi_cxx11_,"streamMeta.dump",&local_46);
      std::allocator<char>::~allocator((allocator<char> *)&local_46);
      __cxa_atexit(std::__cxx11::string::~string,&main::streamMetaFilename_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&main::streamMetaFilename_abi_cxx11_);
    }
    std::ofstream::open(streamMetaFile,&main::streamMetaFilename_abi_cxx11_,0x10);
    std::function<void(hbm::streaming::SubscribedSignal&,unsigned_long,double_const*,unsigned_long)>
    ::
    function<void(&)(hbm::streaming::SubscribedSignal&,unsigned_long,double_const*,unsigned_long),void>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    hbm::streaming::SignalContainer::setDataAsDoubleCb
              ((SignalContainer *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::
    function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
    ::~function((function<void_(hbm::streaming::SubscribedSignal_&,_unsigned_long,_const_double_*,_unsigned_long)>
                 *)0x13c05d);
    std::
    function<void(hbm::streaming::SubscribedSignal&,std::__cxx11::string_const&,Json::Value_const&)>
    ::
    function<void(&)(hbm::streaming::SubscribedSignal&,std::__cxx11::string_const&,Json::Value_const&),void>
              ((function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
                *)in_stack_fffffffffffffed0,
               (_func_void_SubscribedSignal_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr
                *)in_stack_fffffffffffffec8);
    hbm::streaming::SignalContainer::setSignalMetaCb
              ((SignalContainer *)in_stack_fffffffffffffec0,
               (SignalMetaCb_t *)in_stack_fffffffffffffeb8);
    std::
    function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
    ::~function((function<void_(hbm::streaming::SubscribedSignal_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
                 *)0x13c096);
    std::
    function<void(hbm::streaming::StreamClient&,std::__cxx11::string_const&,Json::Value_const&)>::
    function<void(&)(hbm::streaming::StreamClient&,std::__cxx11::string_const&,Json::Value_const&),void>
              (local_a8,(_func_void_StreamClient_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_Value_ptr
                         *)in_stack_fffffffffffffec8);
    hbm::streaming::StreamClient::setStreamMetaCb
              (in_stack_fffffffffffffec0,(StreamMetaCb_t *)in_stack_fffffffffffffeb8);
    std::
    function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
    ::~function((function<void_(hbm::streaming::StreamClient_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_&)>
                 *)0x13c0cf);
    hbm::streaming::StreamClient::setSignalContainer(&streamClient,&signalContainer);
    pcVar4 = (char *)local_10[1];
    paVar3 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar4,paVar3);
    paVar3 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"",paVar3);
    hbm::streaming::StreamClient::start
              (in_stack_00002068,in_stack_00002060,in_stack_00002058,in_stack_00002050);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"syntax: ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    poVar2 = std::operator<<(poVar2," <stream server address>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	// Some signals should lead to a normal shutdown of the daq stream client. Afterwards the program exists.
	signal( SIGTERM, &sigHandler);
	signal( SIGINT, &sigHandler);

	if ((argc<2) || (std::string(argv[1])=="-h") ) {
		std::cout << "syntax: " << argv[0] << " <stream server address>" << std::endl;
		return EXIT_SUCCESS;
	}

	static const std::string streamMetaFilename = "streamMeta.dump";
	streamMetaFile.open(streamMetaFilename);

	signalContainer.setDataAsDoubleCb(dataCb);
	signalContainer.setSignalMetaCb(signalMetaInformationCb);

	streamClient.setStreamMetaCb(streamMetaInformationCb);
	streamClient.setSignalContainer(&signalContainer);

	// connect to the daq stream service and give control to the receiving function.
	// returns on signal (terminate, interrupt) buffer overrun on the server side or loss of connection.
	streamClient.start(argv[1], hbm::streaming::DAQSTREAM_PORT);
	return EXIT_SUCCESS;
}